

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBruteForceSearch.h
# Opt level: O0

bool __thiscall
BGIP_SolverBruteForceSearch<JointPolicyPureVectorForClusteredBG>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverBruteForceSearch<JointPolicyPureVectorForClusteredBG> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  bool bVar1;
  type pJVar2;
  type arg;
  undefined8 uVar3;
  double *in_RDX;
  long *in_RDI;
  double dVar4;
  shared_ptr<PartialJointPolicyDiscretePure> *r;
  shared_ptr<JointPolicyPureVectorForClusteredBG> test_1;
  shared_ptr<PartialJointPolicyDiscretePure> pjpdp;
  shared_ptr<PartialJPDPValuePair> jppv_1;
  shared_ptr<JointPolicyPureVectorForClusteredBG> test;
  shared_ptr<JPPVValuePair> jppv;
  bool foundSolution;
  JPPVValuePair *in_stack_fffffffffffffee8;
  shared_ptr<JointPolicyDiscretePure> *in_stack_fffffffffffffef8;
  shared_ptr<JointPolicyPureVectorForClusteredBG> *r_00;
  shared_ptr<JointPolicyDiscretePure> *in_stack_ffffffffffffff00;
  shared_ptr<JointPolicyPureVector> *in_stack_ffffffffffffff08;
  E *in_stack_ffffffffffffff20;
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_b0;
  shared_ptr local_a0 [16];
  undefined1 local_90 [16];
  shared_ptr<PartialJPDPValuePair> local_80 [48];
  shared_ptr local_50 [32];
  shared_ptr<JPPVValuePair> local_30 [23];
  byte local_19;
  double *local_18;
  
  local_18 = in_RDX;
  if ((*(byte *)(in_RDI + 0x24) & 1) == 0) {
    (**(code **)(*in_RDI + 0x20))();
  }
  local_19 = 0;
  *local_18 = 0.0;
  bVar1 = BayesianGameIdenticalPayoffSolver::IsEmptyJPPV
                    ((BayesianGameIdenticalPayoffSolver *)0x145b22);
  if (bVar1) {
    bVar1 = BayesianGameIdenticalPayoffSolver::IsEmptyPJPDP
                      ((BayesianGameIdenticalPayoffSolver *)0x145cb7);
    if (!bVar1) {
      BayesianGameIdenticalPayoffSolver::GetNextSolutionPJPDP
                ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffee8);
      arg = boost::shared_ptr<PartialJPDPValuePair>::operator->(local_80);
      r = (shared_ptr<PartialJointPolicyDiscretePure> *)(**(code **)(*(long *)arg + 0x18))();
      *local_18 = (double)r;
      if ((double)in_RDI[0x25] <= *local_18) {
        in_stack_ffffffffffffff00 =
             (shared_ptr<JointPolicyDiscretePure> *)
             boost::shared_ptr<PartialJPDPValuePair>::operator->(local_80);
        (**(code **)(in_stack_ffffffffffffff00->px + 0x10))(local_90);
        boost::
        dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>(r);
        bVar1 = boost::shared_ptr::operator_cast_to_bool(local_a0);
        if (!bVar1) {
          uVar3 = __cxa_allocate_exception(0x28);
          E::E(in_stack_ffffffffffffff20,(char *)arg);
          __cxa_throw(uVar3,&E::typeinfo,E::~E);
        }
        local_19 = 1;
        r_00 = &local_b0;
        boost::static_pointer_cast<JointPolicyDiscretePure,JointPolicyPureVectorForClusteredBG>
                  (r_00);
        boost::shared_ptr<JointPolicyDiscretePure>::operator=
                  (in_stack_ffffffffffffff00,(shared_ptr<JointPolicyDiscretePure> *)r_00);
        boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
                  ((shared_ptr<JointPolicyDiscretePure> *)0x145db4);
        BayesianGameIdenticalPayoffSolver::PopNextSolutionPJPDP
                  ((BayesianGameIdenticalPayoffSolver *)0x145dbe);
        boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
                  ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x145e5e);
        boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
                  ((shared_ptr<PartialJointPolicyDiscretePure> *)0x145e6b);
      }
      boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr
                ((shared_ptr<PartialJPDPValuePair> *)0x145e93);
    }
  }
  else {
    BayesianGameIdenticalPayoffSolver::GetNextSolutionJPPV
              ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffee8);
    pJVar2 = boost::shared_ptr<JPPVValuePair>::operator->(local_30);
    dVar4 = (double)(**(code **)(*(long *)pJVar2 + 0x18))();
    *local_18 = dVar4;
    if ((double)in_RDI[0x25] <= *local_18) {
      boost::shared_ptr<JPPVValuePair>::operator->(local_30);
      JPPVValuePair::GetJPPV(in_stack_fffffffffffffee8);
      boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyPureVector>
                (in_stack_ffffffffffffff08);
      boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                ((shared_ptr<JointPolicyPureVector> *)0x145be1);
      bVar1 = boost::shared_ptr::operator_cast_to_bool(local_50);
      if (bVar1) {
        local_19 = 1;
        boost::static_pointer_cast<JointPolicyDiscretePure,JointPolicyPureVectorForClusteredBG>
                  ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)in_stack_fffffffffffffef8);
        boost::shared_ptr<JointPolicyDiscretePure>::operator=
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
                  ((shared_ptr<JointPolicyDiscretePure> *)0x145c35);
        BayesianGameIdenticalPayoffSolver::PopNextSolutionJPPV
                  ((BayesianGameIdenticalPayoffSolver *)0x145c3f);
      }
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
                ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x145c89);
    }
    boost::shared_ptr<JPPVValuePair>::~shared_ptr((shared_ptr<JPPVValuePair> *)0x145c96);
  }
  if ((local_19 & 1) == 0) {
    boost::shared_ptr<JointPolicyDiscretePure>::reset(in_stack_ffffffffffffff00);
    *local_18 = 0.0;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
#if DGNJPAV
        std::cout << "DEBUG: GetNextJointPolicyAndValue called" <<std::endl <<
            "\texpecting a pointer to a "<< typeid(jpol).name() << std::endl;

#endif

        if(!_m_solved)
            Solve();

        // since BFS computes all solutions. we just need to get
        // the next one from the solution and return it

        bool foundSolution = false;
        value = 0;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting from JPPV queue" <<std::endl;
#endif
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            value = jppv->GetValue();
            if(value >= _m_CBGlowerBound)
            {
                boost::shared_ptr<JP> test = boost::dynamic_pointer_cast<JP>(jppv->GetJPPV());
                if(test)
                {
                    foundSolution = true;
                    jpol = boost::static_pointer_cast<JointPolicyDiscretePure>(test);
                    this->PopNextSolutionJPPV();
                }
            }
        }
        else if(!this->IsEmptyPJPDP())
        {
            //alright, if I understand it correctly, it tries to convert the policy returned
            //to a "JointPolicyPureVectorForClusteredBG"
            //
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting from PJPDP queue" <<std::endl;
#endif
            const boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            value = jppv->GetValue();
            if(value >= _m_CBGlowerBound)
            {
                
                boost::shared_ptr<PartialJointPolicyDiscretePure> pjpdp = jppv->GetJPol();
                boost::shared_ptr<JP> test = boost::dynamic_pointer_cast<JP>(pjpdp);
#if DGNJPAV
                std::cout << "\tconversion requested from "<<  typeid( jppv->GetJPol() ).name() 
                          << " to " <<              typeid( test ).name()
                          << std::endl
                          << "\tthe former is a pointer to " <<  typeid( *(jppv->GetJPol()) ).name() 
                          << " ." << std::endl;
#endif
                if(test)
                {
#if DGNJPAV
                    std::cout << "DEBUG: GetNextJointPolicyAndValue - PJPDP conversion success" <<std::endl;
#endif
                    foundSolution = true;
                    //jpol = test;
                    jpol = boost::static_pointer_cast<JointPolicyDiscretePure>(test);
                    this->PopNextSolutionPJPDP();
                }
                else
                {
#if DGNJPAV
                    std::cout << "DEBUG: GetNextJointPolicyAndValue - PJPDP conversion failed!" <<std::endl;
#endif
                    throw E("DEBUG: GetNextJointPolicyAndValue - PJPDP conversion failed!");
                }
            }
        }
        else
        {
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting ERROR - both queues empty?!?" <<std::endl;
#endif
        }

        if(!foundSolution)
        {
//                std::cout << "value " << value << " " <<  this->_m_nrSolutionsReturned <<  " "
//                          << this->GetNrDesiredSolutions() << " " 
//                          << this->GetBGIPI()->GetNrJointPolicies() << std::endl;
            jpol.reset();
            value = 0;
        }
//             std::cout << "found jpol " << jpol << " value " << value << " and " 
//                       << this->GetNrFoundSolutions()
//                       << " solutions left" 
//                       << std::endl;

        return(foundSolution);
    }